

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall
sznet::net::TcpServer::newConnection(TcpServer *this,sz_sock sockfd,InetAddress *peerAddr)

{
  uint id;
  EventLoop *loop;
  self *psVar1;
  TcpConnection *this_00;
  __shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *this_01;
  SourceFile file;
  undefined1 local_10f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_10e0 [503];
  char local_128 [8];
  char buf [64];
  undefined1 local_e0 [12];
  _Bind<void_(sznet::net::TcpServer::*(sznet::net::TcpServer_*,_std::_Placeholder<1>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  local_d0;
  Functor local_b8;
  undefined1 local_98 [8];
  string connName;
  InetAddress localAddr;
  uint local_44;
  undefined1 auStack_40 [4];
  uint32_t connId;
  TcpConnectionPtr conn;
  
  EventLoop::assertInLoopThread(this->m_loop);
  loop = EventLoopThreadPool::getNextLoop
                   ((this->m_threadPool).
                    super___shared_ptr<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  id = this->m_nextConnId;
  this->m_nextConnId = id + 1;
  local_44 = id;
  snprintf(local_128,0x40,"-%s#%d",(this->m_ipPort)._M_dataplus._M_p,(ulong)id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &this->m_name,local_128);
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_e0,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_e0._0_8_;
    file.m_size = local_e0._8_4_;
    Logger::Logger((Logger *)local_10f8,file,0x46);
    psVar1 = LogStream::operator<<((LogStream *)(local_10f8 + 8),"TcpServer::newConnection [");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    psVar1 = LogStream::operator<<(psVar1,"] - new connection [");
    psVar1 = LogStream::operator<<(psVar1,(string *)local_98);
    psVar1 = LogStream::operator<<(psVar1,"] from ");
    InetAddress::toIpPort_abi_cxx11_((string *)((long)&connName.field_2 + 8),peerAddr);
    LogStream::operator<<(psVar1,(string *)((long)&connName.field_2 + 8));
    std::__cxx11::string::~string((string *)(connName.field_2._M_local_buf + 8));
    Logger::~Logger((Logger *)local_10f8);
  }
  sockets::sz_sock_getlocaladdr((sockaddr_in6 *)local_10f8,sockfd);
  connName.field_2._8_8_ = local_10f8._0_8_;
  this_00 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_00,loop,(string *)local_98,id,sockfd,(InetAddress *)((long)&connName.field_2 + 8),
             peerAddr);
  std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::TcpConnection,void>
            ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)auStack_40,
             this_00);
  this_01 = &std::
             map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
             ::operator[](&this->m_connections,&local_44)->
             super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,(__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                     auStack_40);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            (&_auStack_40->m_connectionCallback,&this->m_connectionCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::operator=(&_auStack_40->m_messageCallback,&this->m_messageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            (&_auStack_40->m_writeCompleteCallback,&this->m_writeCompleteCallback);
  local_d0._M_f = (offset_in_TcpServer_to_subr)removeConnection;
  local_d0._8_8_ = 0;
  local_d0._M_bound_args.super__Tuple_impl<0UL,_sznet::net::TcpServer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_sznet::net::TcpServer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::TcpServer_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_sznet::net::TcpServer_*,_std::_Placeholder<1>_>)this;
  std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
  function<std::_Bind<void(sznet::net::TcpServer::*(sznet::net::TcpServer*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)local_10f8,
             &local_d0);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            (&_auStack_40->m_closeCallback,
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)local_10f8);
  std::_Function_base::~_Function_base((_Function_base *)local_10f8);
  local_d0._M_f = (offset_in_TcpServer_to_subr)TcpConnection::connectEstablished;
  local_d0._8_8_ = 0;
  std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
  _Bind<std::shared_ptr<sznet::net::TcpConnection>&>
            ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
              *)local_10f8,&local_d0._M_f,(shared_ptr<sznet::net::TcpConnection> *)auStack_40);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
            ((function<void()> *)&local_b8,
             (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
              *)local_10f8);
  EventLoop::runInLoop(loop,&local_b8);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_10e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void TcpServer::newConnection(sockets::sz_sock sockfd, const InetAddress& peerAddr)
{
	m_loop->assertInLoopThread();
	EventLoop* ioLoop = m_threadPool->getNextLoop();
	char buf[64];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), "-%s#%d", m_ipPort.c_str(), connId);
	string connName = m_name + buf;

	LOG_INFO << "TcpServer::newConnection [" << m_name
		<< "] - new connection [" << connName
		<< "] from " << peerAddr.toIpPort();
	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// ��������
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(ioLoop, connName, connId, sockfd, localAddr, peerAddr));
	m_connections[connId] = conn;
	conn->setConnectionCallback(m_connectionCallback);
	conn->setMessageCallback(m_messageCallback);
	conn->setWriteCompleteCallback(m_writeCompleteCallback);
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&TcpServer::removeConnection, this, std::placeholders::_1));
	ioLoop->runInLoop(std::bind(&TcpConnection::connectEstablished, conn));
}